

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

void testCompositeDeepScanLine(string *tempDir)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting deep compositing interface basic functionality:\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar1 = IlmThread_3_2::supportsThreads();
  random_reseed(1);
  iVar4 = 2;
  while( true ) {
    iVar3 = iVar4 + -1;
    if (iVar4 == 0) break;
    anon_unknown.dwarf_6bac9::test_parts<float>(0,1,true,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(0,1,false,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(0,1,true,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(0,1,false,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(1,1,true,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(1,1,false,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(1,1,true,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(1,1,false,false,tempDir);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Testing deep compositing across multiple parts:\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    anon_unknown.dwarf_6bac9::test_parts<float>(0,5,true,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(0,5,false,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(0,5,true,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(0,5,false,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(1,3,true,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(1,3,false,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(1,3,true,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(1,3,false,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(1,4,true,true,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<float>(1,4,false,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(1,4,true,false,tempDir);
    anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>(1,4,false,true,tempDir);
    bVar5 = iVar4 == 2;
    iVar4 = iVar3;
    if (bVar5 && cVar1 == '\x01') {
      std::operator<<((ostream *)&std::cout," testing with multithreading...\n");
      Imf_3_2::setGlobalThreadCount(0x40);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout," ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testCompositeDeepScanLine (const std::string& tempDir)
{

    cout << "\n\nTesting deep compositing interface basic functionality:\n"
         << endl;

    int passes = 2;
    if (!ILMTHREAD_NAMESPACE::supportsThreads ()) { passes = 1; }

    random_reseed (1);

    for (int pass = 0; pass < 2; pass++)
    {

        test_parts<float> (0, 1, true, true, tempDir);
        test_parts<float> (0, 1, false, false, tempDir);
        test_parts<half> (0, 1, true, false, tempDir);
        test_parts<half> (0, 1, false, true, tempDir);

        //
        // test pattern 1: tested by confirming data is written correctly and
        // then reading correct results in Nuke
        //
        test_parts<float> (1, 1, true, false, tempDir);
        test_parts<float> (1, 1, false, true, tempDir);
        test_parts<half> (1, 1, true, true, tempDir);
        test_parts<half> (1, 1, false, false, tempDir);

        cout << "Testing deep compositing across multiple parts:\n" << endl;

        test_parts<float> (0, 5, true, false, tempDir);
        test_parts<float> (0, 5, false, true, tempDir);
        test_parts<half> (0, 5, true, false, tempDir);
        test_parts<half> (0, 5, false, true, tempDir);

        test_parts<float> (1, 3, true, true, tempDir);
        test_parts<float> (1, 3, false, false, tempDir);
        test_parts<half> (1, 3, true, true, tempDir);
        test_parts<half> (1, 3, false, false, tempDir);

        test_parts<float> (1, 4, true, true, tempDir);
        test_parts<float> (1, 4, false, false, tempDir);
        test_parts<half> (1, 4, true, false, tempDir);
        test_parts<half> (1, 4, false, true, tempDir);

        if (passes == 2 && pass == 0)
        {
            cout << " testing with multithreading...\n";
            setGlobalThreadCount (64);
        }
    }
    cout << " ok\n" << endl;
}